

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void write_other_cert(scep *s)

{
  stack_st_X509 *sk;
  int iVar1;
  OPENSSL_STACK *pOVar2;
  X509 *a;
  X509_NAME *pXVar3;
  char *pcVar4;
  char *pcVar5;
  ASN1_INTEGER *x;
  FILE *fp_00;
  char local_448 [8];
  char buffer [1024];
  X509 *local_40;
  X509 *othercert;
  int i;
  FILE *fp;
  X509 *cert;
  stack_st_X509 *certs;
  PKCS7 *p7;
  scep *s_local;
  
  local_40 = (X509 *)0x0;
  sk = ((s->reply_p7->d).sign)->cert;
  othercert._4_4_ = 0;
  while( true ) {
    pOVar2 = ossl_check_const_X509_sk_type(sk);
    iVar1 = OPENSSL_sk_num(pOVar2);
    a = local_40;
    if (iVar1 <= othercert._4_4_) break;
    pOVar2 = ossl_check_const_X509_sk_type(sk);
    a = (X509 *)OPENSSL_sk_value(pOVar2,othercert._4_4_);
    pcVar5 = pname;
    if (v_flag != 0) {
      pXVar3 = X509_get_subject_name(a);
      pcVar4 = X509_NAME_oneline(pXVar3,local_448,0x400);
      printf("%s: found certificate with\n  subject: %s\n",pcVar5,pcVar4);
      pXVar3 = X509_get_issuer_name(a);
      pcVar5 = X509_NAME_oneline(pXVar3,local_448,0x400);
      printf("  issuer: %s\n",pcVar5);
    }
    x = X509_get_serialNumber(a);
    iVar1 = ASN1_INTEGER_cmp(x,(ASN1_INTEGER *)s->ias_getcert->serial);
    if (iVar1 == 0) break;
    othercert._4_4_ = othercert._4_4_ + 1;
  }
  local_40 = a;
  if (local_40 == (X509 *)0x0) {
    fprintf(_stderr,"%s: cannot find certificate\n",pname);
    exit(0x5d);
  }
  fp_00 = fopen(w_char,"w");
  if (fp_00 != (FILE *)0x0) {
    if (v_flag != 0) {
      printf("%s: certificate written as %s\n",pname,w_char);
    }
    if (d_flag != 0) {
      PEM_write_X509(_stdout,local_40);
    }
    iVar1 = PEM_write_X509(fp_00,local_40);
    if (iVar1 == 1) {
      fclose(fp_00);
      return;
    }
    fprintf(_stderr,"%s: error while writing certificate file\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x5d);
  }
  fprintf(_stderr,"%s: cannot open cert file for writing\n",pname);
  exit(0x5d);
}

Assistant:

void
write_other_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;
	X509 *othercert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
	
	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];

		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
		}
		/* The serial has to match to requested one */
		if (!ASN1_INTEGER_cmp(X509_get_serialNumber(cert),
				s->ias_getcert->serial)) {
				othercert = cert;	
				break;
		}	
	}
	if (othercert == NULL) {
		fprintf(stderr, "%s: cannot find certificate\n", pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, w_char);
	if (d_flag)
		PEM_write_X509(stdout, othercert);
	if (PEM_write_X509(fp, othercert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}